

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

UntypedActionResultHolderBase * __thiscall
testing::internal::UntypedFunctionMockerBase::UntypedInvokeWith
          (UntypedFunctionMockerBase *this,void *untyped_args)

{
  int iVar1;
  size_type sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  ostream *poVar4;
  char *pcVar5;
  undefined8 in_RSI;
  long *in_RDI;
  UntypedActionResultHolderBase *result;
  bool need_to_report_call;
  bool found;
  ExpectationBase *untyped_expectation;
  void *untyped_action;
  stringstream loc;
  stringstream why;
  stringstream ss;
  bool is_excessive;
  UntypedActionResultHolderBase *result_1;
  stringstream ss_1;
  bool need_to_report_uninteresting_call;
  CallReaction reaction;
  string *in_stack_fffffffffffff6c8;
  CallReaction in_stack_fffffffffffff6d4;
  char *in_stack_fffffffffffff6d8;
  undefined1 condition;
  string *local_910;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff700;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  ostream *in_stack_fffffffffffff718;
  UntypedFunctionMockerBase *in_stack_fffffffffffff720;
  undefined8 uVar6;
  string *message;
  LogSeverity severity;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_8a8;
  bool local_881;
  undefined1 *local_870;
  string *local_860;
  undefined1 *local_848;
  undefined1 *local_828;
  bool local_802;
  bool local_801;
  string local_7f8 [32];
  string local_7d8 [32];
  string local_7b8 [32];
  string local_798 [32];
  string local_778 [32];
  string local_758 [39];
  byte local_731;
  string local_730 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_710;
  undefined4 local_708;
  byte local_703;
  byte local_702;
  allocator local_701;
  string local_700 [38];
  bool local_6da;
  byte local_6d9;
  ExpectationBase *local_6d8;
  long local_6d0;
  stringstream local_6c8 [392];
  stringstream local_540 [16];
  undefined1 auStack_530 [376];
  stringstream local_3b8 [16];
  string local_3a8 [11];
  byte local_229;
  string local_228 [32];
  string local_208 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1e8;
  stringstream local_1e0 [16];
  undefined1 auStack_1d0 [399];
  allocator local_41;
  string local_40 [35];
  bool local_1d;
  CallReaction local_1c;
  undefined8 local_18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_8;
  
  local_18 = in_RSI;
  sVar2 = std::
          vector<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>
          ::size((vector<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>
                  *)(in_RDI + 6));
  if (sVar2 == 0) {
    MockObject(in_stack_fffffffffffff720);
    local_1c = Mock::GetReactionOnUninterestingCalls(in_stack_fffffffffffff700);
    if (local_1c == kAllow) {
      local_801 = LogIsVisible(0x16c567);
    }
    else {
      if (local_1c == kDefault) {
        local_802 = LogIsVisible(0x16c584);
      }
      else {
        local_802 = true;
      }
      local_801 = local_802;
    }
    local_1d = local_801;
    if (local_801 == false) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_40,"",&local_41);
      local_8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (**(code **)(*in_RDI + 0x18))(in_RDI,local_18,local_40);
      std::__cxx11::string::~string(local_40);
      std::allocator<char>::~allocator((allocator<char> *)&local_41);
    }
    else {
      std::__cxx11::stringstream::stringstream(local_1e0);
      local_828 = (undefined1 *)0x0;
      if (&stack0x00000000 != (undefined1 *)0x1e0) {
        local_828 = auStack_1d0;
      }
      (**(code **)(*in_RDI + 0x28))(in_RDI,local_18,local_828);
      std::__cxx11::stringstream::str();
      pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (**(code **)(*in_RDI + 0x18))(in_RDI,local_18,local_208);
      std::__cxx11::string::~string(local_208);
      local_1e8 = pbVar3;
      if (pbVar3 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        local_848 = (undefined1 *)0x0;
        if (&stack0x00000000 != (undefined1 *)0x1e0) {
          local_848 = auStack_1d0;
        }
        (**(code **)(*(long *)pbVar3 + 0x10))(pbVar3,local_848);
      }
      std::__cxx11::stringstream::str();
      ReportUninterestingCall(in_stack_fffffffffffff6d4,in_stack_fffffffffffff6c8);
      std::__cxx11::string::~string(local_228);
      local_8 = local_1e8;
      std::__cxx11::stringstream::~stringstream(local_1e0);
    }
  }
  else {
    local_229 = 0;
    std::__cxx11::stringstream::stringstream(local_3b8);
    std::__cxx11::stringstream::stringstream(local_540);
    std::__cxx11::stringstream::stringstream(local_6c8);
    local_6d0 = 0;
    local_860 = (string *)0x0;
    if (&stack0x00000000 != (undefined1 *)0x3b8) {
      local_860 = local_3a8;
    }
    local_870 = (undefined1 *)0x0;
    if (&stack0x00000000 != (undefined1 *)0x540) {
      local_870 = auStack_530;
    }
    local_6d8 = (ExpectationBase *)
                (**(code **)(*in_RDI + 0x30))
                          (in_RDI,local_18,&local_6d0,&local_229,local_860,local_870);
    local_6d9 = local_6d8 != (ExpectationBase *)0x0;
    local_881 = true;
    if (((bool)local_6d9) && (local_881 = true, (local_229 & 1) == 0)) {
      local_881 = LogIsVisible(0x16ca15);
    }
    local_6da = local_881;
    if (local_881 == false) {
      local_702 = 0;
      local_703 = 0;
      if (local_6d0 == 0) {
        std::allocator<char>::allocator();
        local_702 = 1;
        std::__cxx11::string::string(local_700,"",&local_701);
        local_703 = 1;
        local_8a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (**(code **)(*in_RDI + 0x18))(in_RDI,local_18,local_700);
      }
      else {
        local_8a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (**(code **)(*in_RDI + 0x20))(in_RDI,local_6d0,local_18);
      }
      local_8 = local_8a8;
      if ((local_703 & 1) != 0) {
        std::__cxx11::string::~string(local_700);
      }
      if ((local_702 & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_701);
      }
    }
    else {
      poVar4 = std::operator<<((ostream *)local_3a8,"    Function call: ");
      pcVar5 = Name(in_stack_fffffffffffff720);
      std::operator<<(poVar4,pcVar5);
      severity = (LogSeverity)((ulong)pcVar5 >> 0x20);
      message = (string *)0x0;
      if (&stack0x00000000 != (undefined1 *)0x3b8) {
        message = local_3a8;
      }
      uVar6 = local_18;
      (**(code **)(*in_RDI + 0x38))(in_RDI,local_18,message);
      iVar1 = (int)((ulong)uVar6 >> 0x20);
      if (((local_6d9 & 1) != 0) && ((local_229 & 1) == 0)) {
        ExpectationBase::DescribeLocationTo(local_6d8,in_stack_fffffffffffff718);
      }
      local_731 = 0;
      if (local_6d0 == 0) {
        std::__cxx11::stringstream::str();
        local_731 = 1;
        pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (**(code **)(*in_RDI + 0x18))(in_RDI,local_18,local_730);
      }
      else {
        in_stack_fffffffffffff700 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (**(code **)(*in_RDI + 0x20))(in_RDI,local_6d0,local_18);
        pbVar3 = in_stack_fffffffffffff700;
      }
      __lhs = pbVar3;
      if ((local_731 & 1) != 0) {
        std::__cxx11::string::~string(local_730);
      }
      local_710 = pbVar3;
      if (pbVar3 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        local_910 = (string *)0x0;
        if (&stack0x00000000 != (undefined1 *)0x3b8) {
          local_910 = local_3a8;
        }
        (**(code **)(*(long *)pbVar3 + 0x10))(pbVar3,local_910);
      }
      poVar4 = std::operator<<((ostream *)local_3a8,"\n");
      std::__cxx11::stringstream::str();
      std::operator<<(poVar4,local_758);
      condition = (undefined1)((ulong)poVar4 >> 0x38);
      std::__cxx11::string::~string(local_758);
      if ((local_6d9 & 1) == 0) {
        std::__cxx11::stringstream::str();
        Expect((bool)condition,in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d4,
               in_stack_fffffffffffff6c8);
        std::__cxx11::string::~string(local_778);
      }
      else if ((local_229 & 1) == 0) {
        std::__cxx11::stringstream::str();
        std::__cxx11::stringstream::str();
        std::operator+(__lhs,in_stack_fffffffffffff700);
        Log(severity,message,iVar1);
        std::__cxx11::string::~string(local_7b8);
        std::__cxx11::string::~string(local_7f8);
        std::__cxx11::string::~string(local_7d8);
      }
      else {
        pcVar5 = ExpectationBase::file(local_6d8);
        iVar1 = ExpectationBase::line(local_6d8);
        std::__cxx11::stringstream::str();
        Expect((bool)condition,pcVar5,iVar1,in_stack_fffffffffffff6c8);
        std::__cxx11::string::~string(local_798);
      }
      local_8 = local_710;
    }
    local_708 = 1;
    std::__cxx11::stringstream::~stringstream(local_6c8);
    std::__cxx11::stringstream::~stringstream(local_540);
    std::__cxx11::stringstream::~stringstream(local_3b8);
  }
  return (UntypedActionResultHolderBase *)local_8;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
  if (untyped_expectations_.size() == 0) {
    // No expectation is set on this mock method - we have an
    // uninteresting call.

    // We must get Google Mock's reaction on uninteresting calls
    // made on this mock object BEFORE performing the action,
    // because the action may DELETE the mock object and make the
    // following expression meaningless.
    const CallReaction reaction =
        Mock::GetReactionOnUninterestingCalls(MockObject());

    // True iff we need to print this call's arguments and return
    // value.  This definition must be kept in sync with
    // the behavior of ReportUninterestingCall().
    const bool need_to_report_uninteresting_call =
        // If the user allows this uninteresting call, we print it
        // only when he wants informational messages.
        reaction == kAllow ? LogIsVisible(kInfo) :
        // If the user wants this to be a warning, we print it only
        // when he wants to see warnings.
        reaction == kWarn ? LogIsVisible(kWarning) :
        // Otherwise, the user wants this to be an error, and we
        // should always print detailed information in the error.
        true;

    if (!need_to_report_uninteresting_call) {
      // Perform the action without printing the call information.
      return this->UntypedPerformDefaultAction(untyped_args, "");
    }

    // Warns about the uninteresting call.
    ::std::stringstream ss;
    this->UntypedDescribeUninterestingCall(untyped_args, &ss);

    // Calculates the function result.
    const UntypedActionResultHolderBase* const result =
        this->UntypedPerformDefaultAction(untyped_args, ss.str());

    // Prints the function result.
    if (result != NULL)
      result->PrintAsActionResult(&ss);

    ReportUninterestingCall(reaction, ss.str());
    return result;
  }

  bool is_excessive = false;
  ::std::stringstream ss;
  ::std::stringstream why;
  ::std::stringstream loc;
  const void* untyped_action = NULL;

  // The UntypedFindMatchingExpectation() function acquires and
  // releases g_gmock_mutex.
  const ExpectationBase* const untyped_expectation =
      this->UntypedFindMatchingExpectation(
          untyped_args, &untyped_action, &is_excessive,
          &ss, &why);
  const bool found = untyped_expectation != NULL;

  // True iff we need to print the call's arguments and return value.
  // This definition must be kept in sync with the uses of Expect()
  // and Log() in this function.
  const bool need_to_report_call =
      !found || is_excessive || LogIsVisible(kInfo);
  if (!need_to_report_call) {
    // Perform the action without printing the call information.
    return
        untyped_action == NULL ?
        this->UntypedPerformDefaultAction(untyped_args, "") :
        this->UntypedPerformAction(untyped_action, untyped_args);
  }

  ss << "    Function call: " << Name();
  this->UntypedPrintArgs(untyped_args, &ss);

  // In case the action deletes a piece of the expectation, we
  // generate the message beforehand.
  if (found && !is_excessive) {
    untyped_expectation->DescribeLocationTo(&loc);
  }

  const UntypedActionResultHolderBase* const result =
      untyped_action == NULL ?
      this->UntypedPerformDefaultAction(untyped_args, ss.str()) :
      this->UntypedPerformAction(untyped_action, untyped_args);
  if (result != NULL)
    result->PrintAsActionResult(&ss);
  ss << "\n" << why.str();

  if (!found) {
    // No expectation matches this call - reports a failure.
    Expect(false, NULL, -1, ss.str());
  } else if (is_excessive) {
    // We had an upper-bound violation and the failure message is in ss.
    Expect(false, untyped_expectation->file(),
           untyped_expectation->line(), ss.str());
  } else {
    // We had an expected call and the matching expectation is
    // described in ss.
    Log(kInfo, loc.str() + ss.str(), 2);
  }

  return result;
}